

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O0

void helics::
     addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
               (basic_value<toml::type_config> *section,string *name1,string *name2,
               anon_class_8_1_36d583d8 callback)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool found;
  value *in_stack_00000118;
  anon_class_8_1_36d583d8 in_stack_00000120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_21;
  
  __lhs = in_RDI;
  std::operator+(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff17,
                                         CONCAT16(in_stack_ffffffffffffff16,
                                                  in_stack_ffffffffffffff10)));
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  bVar1 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                    (in_stack_00000118,(string *)callback.translator,in_stack_00000120);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  local_21 = (bool)(bVar1 & 1);
  if (local_21 == false) {
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10
                                                )));
    local_21 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                         (in_stack_00000118,(string *)callback.translator,in_stack_00000120);
    in_stack_ffffffffffffff16 = local_21;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0);
  }
  if (local_21 == false) {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffef0);
    iVar2 = toupper((int)*pvVar3);
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffef0);
    *pvVar3 = (value_type)iVar2;
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10
                                                )));
    addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
              (in_stack_00000118,(string *)callback.translator,in_stack_00000120);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  return;
}

Assistant:

void addTargetVariations(const Block& section,
                         const std::string& name1,
                         std::string name2,
                         Callable callback)
{
    bool found = addTargets(section, name1 + "_" + name2, callback);
    if (!found) {
        found = addTargets(section, name1 + name2, callback);
    }
    if (!found) {
        name2.front() = std::toupper(name2.front());
        addTargets(section, name1 + name2, callback);
    }
}